

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_decoder.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,DecoderBuffer *buffer)

{
  bool bVar1;
  bool bVar2;
  int i;
  uint i_00;
  byte bVar3;
  bool v;
  int32_t num_orientations;
  RAnsBitDecoder decoder;
  int local_5c;
  MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *local_58;
  MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
  *local_50;
  RAnsBitDecoder local_48;
  
  local_5c = 0;
  bVar1 = DecoderBuffer::Decode<int>(buffer,&local_5c);
  if (local_5c < 0 || !bVar1) {
    bVar1 = false;
  }
  else {
    local_50 = &this->predictor_;
    local_58 = this;
    MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::ResizeOrientations(local_50,local_5c);
    RAnsBitDecoder::RAnsBitDecoder(&local_48);
    bVar1 = RAnsBitDecoder::StartDecoding(&local_48,buffer);
    i_00 = 0;
    if (bVar1) {
      bVar3 = 0;
      bVar1 = true;
      for (; (int)i_00 < local_5c; i_00 = i_00 + 1) {
        bVar2 = RAnsBitDecoder::DecodeNextBit(&local_48);
        v = (bool)(bVar3 ^ bVar2);
        MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
        ::set_orientation(local_50,i_00,v);
        bVar3 = bVar2 ^ bVar1;
        bVar1 = v;
      }
      bVar1 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                        (&(local_58->
                          super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                          ).
                          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                          .transform_,buffer);
      i_00 = (uint)bVar1;
    }
    bVar1 = SUB41(i_00,0);
    RAnsBitDecoder::~RAnsBitDecoder(&local_48);
  }
  return bVar1;
}

Assistant:

bool MeshPredictionSchemeTexCoordsPortableDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
  // Decode the delta coded orientations.
  int32_t num_orientations = 0;
  if (!buffer->Decode(&num_orientations) || num_orientations < 0) {
    return false;
  }
  predictor_.ResizeOrientations(num_orientations);
  bool last_orientation = true;
  RAnsBitDecoder decoder;
  if (!decoder.StartDecoding(buffer)) {
    return false;
  }
  for (int i = 0; i < num_orientations; ++i) {
    if (!decoder.DecodeNextBit()) {
      last_orientation = !last_orientation;
    }
    predictor_.set_orientation(i, last_orientation);
  }
  decoder.EndDecoding();
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}